

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O3

void __thiscall ProStringList::ProStringList(ProStringList *this,QStringList *list)

{
  long lVar1;
  QString *str;
  QString *str_00;
  long in_FS_OFFSET;
  ProString local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_QList<ProString>).d.d = (Data *)0x0;
  (this->super_QList<ProString>).d.ptr = (ProString *)0x0;
  (this->super_QList<ProString>).d.size = 0;
  QList<ProString>::reserve(&this->super_QList<ProString>,(list->d).size);
  lVar1 = (list->d).size;
  if (lVar1 != 0) {
    str_00 = (list->d).ptr;
    lVar1 = lVar1 * 0x18;
    do {
      ProString::ProString(&local_58,str_00);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                ((QMovableArrayOps<ProString> *)this,(this->super_QList<ProString>).d.size,&local_58
                );
      QList<ProString>::end(&this->super_QList<ProString>);
      if (&(local_58.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_58.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_58.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      str_00 = str_00 + 1;
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ProStringList::ProStringList(const QStringList &list)
{
    reserve(list.size());
    for (const QString &str : list)
        *this << ProString(str);
}